

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

Vec_Ptr_t * Nwk_ManDfs(Nwk_Man_t *pNtk)

{
  Vec_Ptr_t *vNodes;
  Nwk_Obj_t *pObj;
  uint uVar1;
  int i;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes = Vec_PtrAlloc(100);
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,i);
    if (pObj != (Nwk_Obj_t *)0x0) {
      uVar1 = *(uint *)&pObj->field_0x20 & 7;
      if (uVar1 == 2) {
        Nwk_ManDfs_rec(pObj,vNodes);
      }
      else if (uVar1 == 1) {
        pObj->TravId = pObj->pMan->nTravIds;
        Vec_PtrPush(vNodes,pObj);
      }
    }
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Nwk_ManDfs( Nwk_Man_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i;
    Nwk_ManIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 100 );
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) )
        {
            Nwk_ObjSetTravIdCurrent( pObj );
            Vec_PtrPush( vNodes, pObj );
        }
        else if ( Nwk_ObjIsCo(pObj) )
            Nwk_ManDfs_rec( pObj, vNodes );
    }
    return vNodes;
}